

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void int_list_diff(int *a,int *b,int *c)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  iVar2 = *b;
LAB_00149f42:
  if (-1 < iVar2) {
    if (*c < 0) goto LAB_00149f9e;
    while( true ) {
      piVar3 = b + 1;
      iVar1 = *c;
      if (iVar2 == iVar1) break;
      if (iVar2 < iVar1) {
        *a = iVar2;
        a = a + 1;
        iVar2 = *piVar3;
        b = piVar3;
        if (iVar2 < 0) goto LAB_00149fae;
      }
      else {
        if (iVar2 <= iVar1) goto LAB_00149f42;
        piVar3 = c + 1;
        c = c + 1;
        if (*piVar3 < 0) goto joined_r0x00149f91;
      }
    }
    c = c + 1;
    iVar2 = *piVar3;
    b = piVar3;
    goto LAB_00149f42;
  }
LAB_00149fae:
  *a = -1;
  return;
joined_r0x00149f91:
  while (-1 < iVar2) {
LAB_00149f9e:
    b = b + 1;
    *a = iVar2;
    a = a + 1;
    iVar2 = *b;
  }
  goto LAB_00149fae;
}

Assistant:

void int_list_diff(int *a, int *b, int *c) {
  while (1) {
    if (*b < 0) break;
  Lagainc:
    if (*c < 0) {
      while (*b >= 0) *a++ = *b++;
      break;
    }
  Lagainb:
    if (*b == *c) {
      b++;
      c++;
      continue;
    }
    if (*b < *c) {
      *a++ = *b++;
      if (*b < 0) break;
      goto Lagainb;
    }
    if (*c < *b) {
      c++;
      goto Lagainc;
    }
  }
  *a++ = -1;
}